

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O1

int ffcsum(fitsfile *fptr,long nrec,unsigned_long *sum,int *status)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  unsigned_short sbuf [1440];
  ulong local_b78 [361];
  
  if (*status < 1) {
    if (0 < nrec) {
      lVar4 = 0;
      do {
        ffgbyt(fptr,0xb40,local_b78,status);
        ffswap2((short *)local_b78,0x5a0);
        uVar1 = *sum >> 0x10;
        auVar6 = ZEXT416((uint)*sum & 0xffff);
        lVar5 = 0;
        lVar2 = 0;
        do {
          uVar8 = *(ulong *)((long)local_b78 + lVar2 * 4);
          auVar10._8_4_ = (int)(uVar8 >> 0x20);
          auVar10._0_8_ = uVar8;
          auVar10._12_4_ = 0;
          uVar1 = uVar1 + SUB168(auVar10 & _DAT_001d4e40,0);
          lVar5 = lVar5 + SUB168(auVar10 & _DAT_001d4e40,8);
          auVar9._8_2_ = (short)(uVar8 >> 0x30);
          auVar9._0_8_ = uVar8 >> 0x10;
          auVar9._10_6_ = 0;
          lVar7 = auVar6._8_8_;
          auVar6._0_8_ = auVar6._0_8_ + SUB168(auVar9 & _DAT_001d4e40,0);
          auVar6._8_8_ = lVar7 + SUB168(auVar9 & _DAT_001d4e40,8);
          lVar2 = lVar2 + 2;
        } while (lVar2 != 0x2d0);
        uVar8 = auVar6._8_8_ + auVar6._0_8_;
        uVar1 = lVar5 + uVar1;
        while( true ) {
          uVar3 = uVar1 >> 0x10;
          if (uVar8 >> 0x10 == 0 && uVar3 == 0) break;
          uVar1 = (uVar1 & 0xffff) + (uVar8 >> 0x10);
          uVar8 = (uVar8 & 0xffff) + uVar3;
        }
        *sum = uVar1 * 0x10000 + uVar8;
        lVar4 = lVar4 + 1;
      } while (lVar4 != nrec);
    }
    return *status;
  }
  return *status;
}

Assistant:

int ffcsum(fitsfile *fptr,      /* I - FITS file pointer                  */
           long nrec,           /* I - number of 2880-byte blocks to sum  */
           unsigned long *sum,  /* IO - accumulated checksum              */
           int *status)         /* IO - error status                      */
/*
    Calculate a 32-bit 1's complement checksum of the FITS 2880-byte blocks.
    This routine is based on the C algorithm developed by Rob
    Seaman at NOAO that was presented at the 1994 ADASS conference,  
    published in the Astronomical Society of the Pacific Conference Series.
    This uses a 32-bit 1's complement checksum in which the overflow bits
    are permuted back into the sum and therefore all bit positions are
    sampled evenly. 
*/
{
    long ii, jj;
    unsigned short sbuf[1440];
    unsigned long hi, lo, hicarry, locarry;

    if (*status > 0)
        return(*status);
  /*
    Sum the specified number of FITS 2880-byte records.  This assumes that
    the FITSIO file pointer points to the start of the records to be summed.
    Read each FITS block as 1440 short values (do byte swapping if needed).
  */
    for (jj = 0; jj < nrec; jj++)
    {
      ffgbyt(fptr, 2880, sbuf, status);

#if BYTESWAPPED

      ffswap2( (short *)sbuf, 1440); /* reverse order of bytes in each value */

#endif

      hi = (*sum >> 16);
      lo = *sum & 0xFFFF;

      for (ii = 0; ii < 1440; ii += 2)
      {
        hi += sbuf[ii];
        lo += sbuf[ii+1];
      }

      hicarry = hi >> 16;    /* fold carry bits in */
      locarry = lo >> 16;

      while (hicarry | locarry)
      {
        hi = (hi & 0xFFFF) + locarry;
        lo = (lo & 0xFFFF) + hicarry;
        hicarry = hi >> 16;
        locarry = lo >> 16;
      }

      *sum = (hi << 16) + lo;
    }
    return(*status);
}